

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O2

void operator_suite::run(void)

{
  int in_ESI;
  char *in_RDI;
  
  addition_assignment();
  addition();
  subtraction_assignment();
  subtraction();
  difference_partial();
  difference_0();
  difference_1();
  difference_2();
  difference_3();
  index(in_RDI,in_ESI);
  less();
  less_equal();
  greater();
  greater_equal();
  return;
}

Assistant:

void run()
{
    addition_assignment();
    addition();
    subtraction_assignment();
    subtraction();
    difference_partial();
    difference_0();
    difference_1();
    difference_2();
    difference_3();
    index();
    less();
    less_equal();
    greater();
    greater_equal();
}